

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall
re2::Prog::SearchBitState
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int nsubmatch;
  bool bVar1;
  StringPiece *submatch;
  int iVar2;
  StringPiece *pSVar3;
  StringPiece sp0;
  BitState b;
  
  sp0.ptr_ = (char *)0x0;
  sp0.length_ = 0;
  iVar2 = 1;
  if (1 < nmatch) {
    iVar2 = nmatch;
  }
  pSVar3 = match;
  if (nmatch < 1) {
    pSVar3 = &sp0;
  }
  submatch = match;
  nsubmatch = nmatch;
  if (kind == kFullMatch) {
    submatch = pSVar3;
    nsubmatch = iVar2;
  }
  b.text_.ptr_ = (char *)0x0;
  b.text_.length_ = 0;
  b.context_.ptr_ = (char *)0x0;
  b.context_.length_ = 0;
  b.anchored_ = false;
  b.longest_ = false;
  b.endmatch_ = false;
  b.submatch_ = (StringPiece *)0x0;
  b.nsubmatch_ = 0;
  b.cap_ = (char **)0x0;
  b.ncap_ = 0;
  b.visited_ = (uint32 *)0x0;
  b.nvisited_ = 0;
  b.job_ = (Job *)0x0;
  b.njob_ = 0;
  b.maxjob_ = 0;
  b.prog_ = this;
  bVar1 = BitState::Search(&b,text,context,anchor == kAnchored || kind == kFullMatch,
                           kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch < 1) {
        match = &sp0;
      }
      if (pSVar3->ptr_ + match->length_ != text->ptr_ + text->length_) goto LAB_001253cc;
    }
    bVar1 = true;
  }
  else {
LAB_001253cc:
    bVar1 = false;
  }
  BitState::~BitState(&b);
  return bVar1;
}

Assistant:

bool Prog::SearchBitState(const StringPiece& text,
                          const StringPiece& context,
                          Anchor anchor,
                          MatchKind kind,
                          StringPiece* match,
                          int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  BitState b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}